

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie_quant.c
# Opt level: O2

float lm_trie_quant_mpread(lm_trie_quant_t *quant,bitarr_address_t address,int order_minus_2)

{
  uint32 uVar1;
  bitarr_address_t address_00;
  
  address_00.offset = (uint)quant->bo_bits + address.offset;
  address_00.base = address.base;
  address_00._12_4_ = 0;
  uVar1 = bitarr_read_int25(address_00,quant->prob_bits,quant->prob_mask);
  return (float)quant->tables[order_minus_2][0].begin[uVar1];
}

Assistant:

float32
lm_trie_quant_mpread(lm_trie_quant_t * quant, bitarr_address_t address,
                     int order_minus_2)
{
    address.offset += quant->bo_bits;
    return bins_decode(&quant->tables[order_minus_2][0],
                       bitarr_read_int25(address, quant->prob_bits,
                                         quant->prob_mask));
}